

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ToString.hpp
# Opt level: O3

string * __thiscall
ut11::utility::detail::
ParseIterableToString<std::vector<ut11::Category,std::allocator<ut11::Category>>>::
operator()[abi_cxx11_
          (string *__return_storage_ptr__,void *this,
          vector<ut11::Category,_std::allocator<ut11::Category>_> *value)

{
  pointer pCVar1;
  string *psVar2;
  ostream *poVar3;
  pointer value_00;
  stringstream stream;
  ParseToString<ut11::Category> local_1e1;
  string *local_1e0;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"{ ",2);
  value_00 = (value->super__Vector_base<ut11::Category,_std::allocator<ut11::Category>_>)._M_impl.
             super__Vector_impl_data._M_start;
  pCVar1 = (value->super__Vector_base<ut11::Category,_std::allocator<ut11::Category>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_1e0 = __return_storage_ptr__;
  if (value_00 != pCVar1) {
    do {
      ParseToString<ut11::Category>::operator()[abi_cxx11_(&local_1d8,&local_1e1,value_00);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p);
      }
      value_00 = value_00 + 1;
    } while (value_00 != pCVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"}",1);
  psVar2 = local_1e0;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return psVar2;
}

Assistant:

inline std::string operator()(const V& value) const
				{
					std::stringstream stream;
					stream << "{ ";
					for (const auto& arg : value)
						stream << ToString(arg) << " ";
					stream << "}";
					return stream.str();
				}